

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O0

PatternClip * __thiscall PatternModel::clip(PatternClip *__return_storage_ptr__,PatternModel *this)

{
  PatternSelection *pPVar1;
  PatternSelection region;
  PatternAnchor anchor;
  PatternCursorBase local_6c;
  PatternSelection local_60;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined1 local_19;
  PatternModel *local_18;
  PatternModel *this_local;
  PatternClip *clip;
  
  local_19 = 0;
  local_18 = this;
  this_local = (PatternModel *)__return_storage_ptr__;
  PatternClip::PatternClip(__return_storage_ptr__);
  if ((this->mHasSelection & 1U) == 0) {
    PatternAnchor::PatternAnchor
              ((PatternAnchor *)&local_6c,(PatternCursor)(this->mCursor).super_PatternCursorBase);
    anchor.super_PatternCursorBase.track = local_6c.track;
    anchor.super_PatternCursorBase.row = local_6c.row;
    anchor.super_PatternCursorBase.column = local_6c.column;
    PatternSelection::PatternSelection(&local_60,anchor);
    region.mStart.super_PatternCursorBase.track = local_60.mStart.super_PatternCursorBase.track;
    region.mEnd.super_PatternCursorBase.row = local_60.mEnd.super_PatternCursorBase.row;
    region.mStart.super_PatternCursorBase.row = local_60.mStart.super_PatternCursorBase.row;
    region.mStart.super_PatternCursorBase.column = local_60.mStart.super_PatternCursorBase.column;
    region.mEnd.super_PatternCursorBase.column = local_60.mEnd.super_PatternCursorBase.column;
    region.mEnd.super_PatternCursorBase.track = local_60.mEnd.super_PatternCursorBase.track;
    PatternClip::save(__return_storage_ptr__,&this->mPatternCurr,region);
  }
  else {
    local_28._0_4_ = (this->mSelection).mEnd.super_PatternCursorBase.column;
    local_28._4_4_ = (this->mSelection).mEnd.super_PatternCursorBase.track;
    pPVar1 = &this->mSelection;
    local_38._0_4_ = (pPVar1->mStart).super_PatternCursorBase.row;
    local_38._4_4_ = (pPVar1->mStart).super_PatternCursorBase.column;
    uStack_30 = *(undefined8 *)&(this->mSelection).mStart.super_PatternCursorBase.track;
    PatternClip::save(__return_storage_ptr__,&this->mPatternCurr,*pPVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

PatternClip PatternModel::clip() {
    PatternClip clip;
    
    if (mHasSelection) {
        clip.save(mPatternCurr, mSelection);
    } else {
        clip.save(mPatternCurr, PatternSelection(mCursor));
    }

    return clip;
}